

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O3

void do_nonatomic_op_i64(TCGContext_conflict9 *tcg_ctx,TCGv_i64 ret,TCGv_i32 addr,TCGv_i64 val,
                        TCGArg idx,MemOp memop,_Bool new_val,
                        _func_void_TCGContext_ptr_TCGv_i64_TCGv_i64_TCGv_i64_conflict9 *gen)

{
  TCGTemp *ts;
  TCGTemp *ts_00;
  TCGOp *pTVar1;
  TCGv_i64 val_00;
  TCGv_i64 val_01;
  uintptr_t o;
  MemOp opc;
  uint uVar2;
  uint local_58;
  
  ts = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I64,false);
  val_00 = (TCGv_i64)((long)ts - (long)tcg_ctx);
  ts_00 = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I64,false);
  opc = memop & ~MO_BE;
  if ((memop & MO_64) != MO_8) {
    opc = memop;
  }
  tcg_gen_qemu_ld_i64_tricore(tcg_ctx,val_00,addr,idx,opc & ~MO_ASHIFT);
  (*gen)(tcg_ctx,(TCGv_i64)((long)ts_00 - (long)tcg_ctx),val_00,val);
  uVar2 = opc << 4 & 0xffffff30;
  if ((opc & MO_64) != MO_8) {
    uVar2 = opc << 4;
  }
  local_58 = (uint)idx;
  pTVar1 = tcg_emit_op_tricore(tcg_ctx,INDEX_op_qemu_st_i64);
  pTVar1->args[0] = (TCGArg)ts_00;
  pTVar1->args[1] = (TCGArg)(addr + (long)tcg_ctx);
  pTVar1->args[2] = (ulong)(uVar2 & 0xffffffb0 | local_58);
  check_exit_request_tricore(tcg_ctx);
  val_01 = (TCGv_i64)((long)ts_00 - (long)tcg_ctx);
  if (!new_val) {
    val_01 = val_00;
  }
  tcg_gen_ext_i64(tcg_ctx,ret,val_01,opc);
  tcg_temp_free_internal_tricore(tcg_ctx,ts);
  tcg_temp_free_internal_tricore(tcg_ctx,ts_00);
  return;
}

Assistant:

static void do_nonatomic_op_i64(TCGContext *tcg_ctx, TCGv_i64 ret, TCGv addr, TCGv_i64 val,
                                TCGArg idx, MemOp memop, bool new_val,
                                void (*gen)(TCGContext *tcg_ctx, TCGv_i64, TCGv_i64, TCGv_i64))
{
    TCGv_i64 t1 = tcg_temp_new_i64(tcg_ctx);
    TCGv_i64 t2 = tcg_temp_new_i64(tcg_ctx);

    memop = tcg_canonicalize_memop(memop, 1, 0);

    tcg_gen_qemu_ld_i64(tcg_ctx, t1, addr, idx, memop & ~MO_SIGN);
    gen(tcg_ctx, t2, t1, val);
    tcg_gen_qemu_st_i64(tcg_ctx, t2, addr, idx, memop);

    tcg_gen_ext_i64(tcg_ctx, ret, (new_val ? t2 : t1), memop);
    tcg_temp_free_i64(tcg_ctx, t1);
    tcg_temp_free_i64(tcg_ctx, t2);
}